

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> * __thiscall
capnp::compiler::NodeTranslator::compileAnnotationApplications
          (Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *__return_storage_ptr__,
          NodeTranslator *this,Reader annotations,StringPtr targetsFlagName)

{
  BrandedDecl *pBVar1;
  Resolver *pRVar2;
  ErrorReporter *pEVar3;
  Builder target;
  Reader source;
  Reader type;
  Reader source_00;
  Builder target_00;
  Reader type_00;
  ImplicitParams implicitMethodParams;
  undefined1 auVar4 [40];
  Builder target_01;
  Reader name_00;
  Reader name_01;
  Reader name_02;
  Reader name_03;
  StringPtr name_04;
  undefined4 uVar5;
  BrandScope *pBVar6;
  ReaderFor<bool> RVar7;
  undefined1 uVar8;
  BrandScope **ppBVar9;
  ListElementCount LVar10;
  undefined1 auVar11 [8];
  WirePointer *pWVar12;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar13;
  ulong uVar14;
  undefined8 uVar15;
  ushort uVar16;
  BrandScope *pBVar17;
  size_t sVar18;
  BrandScope **ppBVar19;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar20;
  NodeTranslator *this_00;
  undefined8 params_2;
  ElementCount index;
  long lVar21;
  ulong uVar22;
  byte *pbVar23;
  undefined8 uVar24;
  DebugExpression<bool> DVar25;
  DebugExpression<bool> _kjCondition;
  Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *result;
  Vector<capnp::compiler::BrandScope_*> levels;
  Reader name;
  Builder scopes;
  Builder annotationBuilder;
  Builder bindings;
  Reader annotation;
  BuilderFor<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> builder;
  SegmentReader *pSVar26;
  CapTableReader *pCVar27;
  void *pvVar28;
  WirePointer *pWVar29;
  StructDataBitCount SVar30;
  int iVar31;
  WirePointer *in_stack_fffffffffffffb20;
  undefined8 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb30;
  ElementCount EVar32;
  undefined7 uVar33;
  undefined8 uVar34;
  undefined1 uStack_499;
  byte *local_498;
  undefined1 local_478 [16];
  BrandScope **local_468;
  ArrayDisposer *local_460;
  NodeTranslator *local_450;
  StructReader local_448;
  undefined1 local_418 [8];
  anon_union_64_12_1c583c3a_for_Reader_1 aStack_410;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  Disposer *local_3a8;
  BrandScope *pBStack_3a0;
  undefined8 local_398 [6];
  byte *local_368;
  undefined8 uStack_360;
  undefined1 local_358 [16];
  StructBuilder local_348;
  ListBuilder local_318;
  undefined8 local_2f0;
  char *local_2e8;
  size_t local_2e0;
  Reader *local_2d8;
  undefined8 *local_2d0;
  StructReader local_2c8;
  Maybe<capnp::Schema> local_298;
  StructBuilder local_288;
  StructBuilder local_260;
  PointerBuilder local_238;
  undefined1 local_218 [8];
  BrandedDecl BStack_210;
  StructBuilder local_168;
  undefined1 local_140 [48];
  BrandScope *pBStack_110;
  word local_108;
  SegmentBuilder *pSStack_100;
  CapTableBuilder *local_f8;
  word *pwStack_f0;
  StructReader local_e8;
  StructReader local_b8 [2];
  ListBuilder local_58;
  
  local_2e0 = targetsFlagName.content.size_;
  local_2e8 = targetsFlagName.content.ptr;
  if ((annotations.reader.elementCount == 0) || (this->compileAnnotations == false)) {
    (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
    (__return_storage_ptr__->builder).location = (word *)0x0;
    (__return_storage_ptr__->builder).tag = 0;
    (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
  }
  else {
    params_2 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x20001;
    capnp::_::OrphanBuilder::initStructList
              ((OrphanBuilder *)local_218,(this->orphanage).arena,(this->orphanage).capTable,
               annotations.reader.elementCount,(StructSize)0x20001);
    (__return_storage_ptr__->builder).segment = (SegmentBuilder *)BStack_210.body._0_8_;
    (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)BStack_210.body.field_1._0_8_;
    (__return_storage_ptr__->builder).location = (word *)BStack_210.body.field_1._8_8_;
    (__return_storage_ptr__->builder).tag.content = (uint64_t)local_218;
    capnp::_::OrphanBuilder::asStructList
              (&local_58,&__return_storage_ptr__->builder,(StructSize)0x20001);
    if (annotations.reader.elementCount != 0) {
      local_2d8 = &BStack_210.source;
      local_2d0 = local_398;
      local_2f0 = 0x6d2a48;
      index = 0;
      local_450 = this;
      do {
        capnp::_::ListReader::getStructElement(&local_2c8,&annotations.reader,index);
        capnp::_::ListBuilder::getStructElement(&local_348,&local_58,index);
        aStack_410.intValue = (int64_t)local_348.capTable;
        local_418 = (undefined1  [8])local_348.segment;
        aStack_410.textValue.super_StringPtr.content.size_ = (size_t)local_348.pointers;
        capnp::_::PointerBuilder::initStruct
                  ((StructBuilder *)local_218,(PointerBuilder *)local_418,(StructSize)0x10002);
        *(undefined2 *)BStack_210.body.field_1._0_8_ = 0;
        LVar10 = local_2c8.nestingLimit;
        BStack_210.body.field_1._0_8_ = local_2c8.pointers;
        if (local_2c8.pointerCount == 0) {
          BStack_210.body.field_1._0_8_ = (WirePointer *)0x0;
          LVar10 = 0x7fffffff;
        }
        local_218 = (undefined1  [8])(Exception *)0x0;
        BStack_210.body._0_8_ = (SegmentBuilder *)0x0;
        if (local_2c8.pointerCount != 0) {
          local_218 = (undefined1  [8])local_2c8.segment;
          BStack_210.body._0_8_ = local_2c8.capTable;
        }
        BStack_210.body.field_1._8_4_ = LVar10;
        capnp::_::PointerReader::getStruct(&local_448,(PointerReader *)local_218,(word *)0x0);
        pWVar12 = (WirePointer *)0x0;
        DVar25.value = false;
        uVar33 = 0;
        aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
        local_498 = (byte *)CONCAT44(local_498._4_4_,0x7fffffff);
        implicitMethodParams.params.reader._39_1_ = uStack_499;
        implicitMethodParams.params.reader.structDataSize = 0;
        implicitMethodParams.params.reader.structPointerCount = 0;
        implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
        source._reader.capTable = local_448.capTable;
        source._reader.segment = local_448.segment;
        source._reader.data = local_448.data;
        source._reader.pointers = local_448.pointers;
        source._reader.dataSize = local_448.dataSize;
        source._reader.pointerCount = local_448.pointerCount;
        source._reader._38_2_ = local_448._38_2_;
        source._reader.nestingLimit = local_448.nestingLimit;
        source._reader._44_4_ = local_448._44_4_;
        auVar4 = ZEXT2440(ZEXT824(0));
        implicitMethodParams.scopeId = auVar4._0_8_;
        implicitMethodParams.params.reader.segment = (SegmentReader *)auVar4._8_8_;
        implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar4._16_8_;
        implicitMethodParams.params.reader.ptr = (byte *)auVar4._24_8_;
        implicitMethodParams.params.reader.elementCount = auVar4._32_4_;
        implicitMethodParams.params.reader.step = auVar4._36_4_;
        implicitMethodParams.params.reader._40_8_ = local_498;
        BrandScope::compileDeclExpression
                  ((Maybe<capnp::compiler::BrandedDecl> *)local_418,(this->localBrand).ptr,source,
                   this->resolver,implicitMethodParams);
        local_218[0] = local_418[0];
        uVar8 = local_418[0];
        if (local_418[0] == VOID) {
          BStack_210.body.tag = aStack_410.intValue._0_4_;
          if (aStack_410.intValue._0_4_ == 2) {
            BStack_210.body.field_1._8_8_ = CONCAT44(aStack_410._20_4_,aStack_410._16_4_);
            BStack_210.body.field_1._0_8_ = aStack_410.textValue.super_StringPtr.content.size_;
          }
          else if (aStack_410.intValue._0_4_ == 1) {
            BStack_210.body.field_1._32_8_ = aStack_410._40_8_;
            BStack_210.body.field_1._8_8_ = CONCAT44(aStack_410._20_4_,aStack_410._16_4_);
            BStack_210.body.field_1._24_8_ = aStack_410.listValue.reader.ptr;
            BStack_210.body.field_1._0_8_ = aStack_410.textValue.super_StringPtr.content.size_;
            BStack_210.body.field_1.space[0x28] = aStack_410.listValue.reader.structDataSize._0_1_;
            if (aStack_410.listValue.reader.structDataSize._0_1_ == '\x01') {
              BStack_210.body.field_1._80_8_ = local_3b8;
              BStack_210.body.field_1._88_8_ = uStack_3b0;
              BStack_210.body.field_1._64_8_ = local_3c8;
              BStack_210.body.field_1._72_8_ = uStack_3c0;
              BStack_210.body.field_1._48_8_ = aStack_410._56_8_;
              BStack_210.body.field_1._56_8_ = uStack_3d0;
              aStack_410.listValue.reader.structDataSize._0_1_ = '\0';
            }
          }
          BStack_210.brand.disposer = local_3a8;
          BStack_210.brand.ptr = pBStack_3a0;
          pSVar26 = (SegmentReader *)*local_2d0;
          pCVar27 = (CapTableReader *)local_2d0[1];
          pvVar28 = (void *)local_2d0[2];
          pWVar29 = (WirePointer *)local_2d0[3];
          uVar24 = local_2d0[4];
          uVar15 = local_2d0[5];
          (local_2d8->_reader).dataSize = (int)uVar24;
          (local_2d8->_reader).pointerCount = (short)((ulong)uVar24 >> 0x20);
          *(short *)&(local_2d8->_reader).field_0x26 = (short)((ulong)uVar24 >> 0x30);
          *(undefined8 *)&(local_2d8->_reader).nestingLimit = uVar15;
          (local_2d8->_reader).data = pvVar28;
          (local_2d8->_reader).pointers = pWVar29;
          (local_2d8->_reader).segment = pSVar26;
          (local_2d8->_reader).capTable = pCVar27;
          BrandedDecl::getKind(&BStack_210);
          pBVar6 = BStack_210.brand.ptr;
          iVar31 = local_448.nestingLimit;
          if (local_418[0] == VOID) {
            if (local_418._2_2_ == 0xb) {
              DVar25.value = BStack_210.body.tag == 1;
              if (!DVar25.value) {
                kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                          ((Fault *)local_418,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.h"
                           ,0x115,FAILED,"body.is<Resolver::ResolvedDecl>()","_kjCondition,",
                           (DebugExpression<bool> *)&stack0xfffffffffffffb38);
                kj::_::Debug::Fault::fatal((Fault *)local_418);
              }
              local_478 = (undefined1  [16])0x0;
              local_468 = (BrandScope **)0x0;
              local_460 = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
              ppBVar9 = (BrandScope **)0x0;
              pBVar17 = BStack_210.brand.ptr;
              EVar32 = index;
              do {
                if (((pBVar17->params).size_ != 0) ||
                   ((pBVar17->inherited == true && (pBVar17->leafParamCount != 0)))) {
                  if (ppBVar9 == local_468) {
                    sVar18 = (long)ppBVar9 - local_478._0_8_ >> 2;
                    if (ppBVar9 == (BrandScope **)local_478._0_8_) {
                      sVar18 = 4;
                    }
                    kj::Vector<capnp::compiler::BrandScope_*>::setCapacity
                              ((Vector<capnp::compiler::BrandScope_*> *)local_478,sVar18);
                    ppBVar9 = (BrandScope **)local_478._8_8_;
                  }
                  *ppBVar9 = pBVar17;
                  ppBVar9 = (BrandScope **)(local_478._8_8_ + 8);
                  local_478._8_8_ = ppBVar9;
                }
                pBVar17 = (pBVar17->parent).ptr.ptr;
              } while (pBVar17 != (BrandScope *)0x0);
              ppBVar19 = (BrandScope **)local_478._0_8_;
              if (ppBVar9 != (BrandScope **)local_478._0_8_) {
                local_318.ptr = (byte *)((long)local_348.pointers + 8);
                local_318.segment = local_348.segment;
                local_318.capTable = local_348.capTable;
                capnp::_::PointerBuilder::initStruct
                          ((StructBuilder *)&stack0xfffffffffffffb38,(PointerBuilder *)&local_318,
                           (StructSize)0x10000);
                local_318.ptr = (byte *)0x0;
                local_318.segment = (SegmentBuilder *)CONCAT71(uVar33,DVar25.value);
                local_318.capTable = (CapTableBuilder *)aVar13;
                capnp::_::PointerBuilder::initStructList
                          ((ListBuilder *)local_418,(PointerBuilder *)&local_318,
                           (ElementCount)((ulong)(local_478._8_8_ - local_478._0_8_) >> 3),
                           (StructSize)0x10002);
                ppBVar19 = (BrandScope **)local_478._0_8_;
                if (local_478._8_8_ - local_478._0_8_ != 0) {
                  local_368 = (byte *)((long)(local_478._8_8_ - local_478._0_8_) >> 3);
                  pbVar23 = (byte *)0x0;
                  do {
                    capnp::_::ListBuilder::getStructElement
                              ((StructBuilder *)&stack0xfffffffffffffb38,(ListBuilder *)local_418,
                               (ElementCount)pbVar23);
                    local_358._0_8_ = pbVar23;
                    pBVar17 = *(BrandScope **)(local_478._0_8_ + ((ulong)pbVar23 & 0xffffffff) * 8);
                    uVar5 = *(undefined4 *)((long)&pBVar17->leafId + 4);
                    pWVar12->offsetAndKind =
                         (WireValue<uint32_t>_conflict)*(undefined4 *)&pBVar17->leafId;
                    pWVar12->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)uVar5;
                    if (pBVar17->inherited == true) {
                      *(undefined2 *)&pWVar12[1].offsetAndKind.value = 1;
                    }
                    else {
                      sVar18 = (pBVar17->params).size_;
                      *(undefined2 *)&pWVar12[1].offsetAndKind.value = 0;
                      local_288.data = (undefined2 *)0x0;
                      local_288.segment = (SegmentBuilder *)CONCAT71(uVar33,DVar25.value);
                      index = EVar32;
                      local_288.capTable = (CapTableBuilder *)aVar13;
                      capnp::_::PointerBuilder::initStructList
                                (&local_318,(PointerBuilder *)&local_288,(ElementCount)sVar18,
                                 (StructSize)0x10001);
                      uVar14 = (ulong)local_318.elementCount;
                      this = local_450;
                      EVar32 = index;
                      if (uVar14 != 0) {
                        lVar21 = 0;
                        uVar22 = 0;
                        do {
                          pBVar1 = ((*(BrandScope **)
                                      (local_478._0_8_ + ((ulong)pbVar23 & 0xffffffff) * 8))->params
                                   ).ptr;
                          pEVar3 = pBVar6->errorReporter;
                          capnp::_::ListBuilder::getStructElement
                                    (&local_288,&local_318,(ElementCount)uVar22);
                          *(undefined2 *)local_288.data = 1;
                          local_238.segment = local_288.segment;
                          local_238.capTable = local_288.capTable;
                          local_238.pointer = local_288.pointers;
                          capnp::_::PointerBuilder::initStruct
                                    (&local_260,&local_238,(StructSize)0x10003);
                          target._builder.segment._1_7_ = local_260.segment._1_7_;
                          target._builder.segment._0_1_ = (char)local_260.segment;
                          target._builder.capTable = local_260.capTable;
                          target._builder.data = local_260.data;
                          target._builder.pointers = local_260.pointers;
                          target._builder.dataSize = local_260.dataSize;
                          target._builder._36_4_ = local_260._36_4_;
                          BrandedDecl::compileAsType
                                    ((BrandedDecl *)((long)&(pBVar1->body).tag + lVar21),pEVar3,
                                     target);
                          uVar22 = uVar22 + 1;
                          lVar21 = lVar21 + 0xa8;
                          this = local_450;
                          EVar32 = index;
                        } while (uVar14 != uVar22);
                      }
                    }
                    pbVar23 = (byte *)(local_358._0_8_ + 1);
                  } while (pbVar23 != local_368);
                  ppBVar19 = (BrandScope **)local_478._0_8_;
                }
              }
              ppBVar9 = local_468;
              if (ppBVar19 != (BrandScope **)0x0) {
                local_478 = (undefined1  [16])0x0;
                local_468 = (BrandScope **)0x0;
                params_2 = (long)ppBVar9 - (long)ppBVar19 >> 3;
                (**local_460->_vptr_ArrayDisposer)(local_460,ppBVar19,8);
              }
              uVar24 = BStack_210.body.field_1._0_8_;
              *(undefined8 *)local_348.data = BStack_210.body.field_1._0_8_;
              pRVar2 = this->resolver;
              capnp::_::PointerBuilder::getStruct
                        ((StructBuilder *)local_418,(PointerBuilder *)&stack0xfffffffffffffb38,
                         (StructSize)0x10000,(word *)0x0);
              capnp::_::StructBuilder::asReader((StructBuilder *)local_418);
              (*pRVar2->_vptr_Resolver[6])(&local_260,pRVar2,uVar24);
              local_318.segment =
                   (SegmentBuilder *)CONCAT71(local_318.segment._1_7_,(char)local_260.segment);
              if ((char)local_260.segment == '\x01') {
                local_318.capTable = local_260.capTable;
                Schema::getProto((Reader *)local_418,(Schema *)&local_318.capTable);
                uVar15 = aStack_410.listValue.reader.ptr;
                aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)local_418;
                uVar24 = aStack_410.intValue;
                lVar21 = CONCAT44(aStack_410._20_4_,aStack_410._16_4_);
                params_2._4_4_ = 0;
                params_2._0_4_ = aStack_410._28_4_;
                local_358._0_4_ = aStack_410._28_4_;
                uStack_499 = (undefined1)((uint)aStack_410._28_4_ >> 0x18);
                local_498 = aStack_410.listValue.reader.ptr;
                DVar25.value = SUB81(local_2f0,0);
                uVar33 = (undefined7)((ulong)local_2f0 >> 8);
                name_04.content.size_ = local_2e0;
                name_04.content.ptr = local_2e8;
                aVar20 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)local_418;
                uVar34 = aStack_410.intValue;
                DynamicStruct::Reader::get
                          ((Reader *)local_418,(Reader *)&stack0xfffffffffffffb38,name_04);
                RVar7 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply
                                  ((Reader *)local_418);
                DynamicValue::Reader::~Reader((Reader *)local_418);
                if (!RVar7) {
                  pEVar3 = local_450->errorReporter;
                  name_00._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb28;
                  name_00._reader.segment = (SegmentReader *)in_stack_fffffffffffffb20;
                  name_00._reader.data._0_4_ = in_stack_fffffffffffffb30;
                  name_00._reader.data._4_4_ = EVar32;
                  name_00._reader.pointers._0_1_ = DVar25.value;
                  name_00._reader.pointers._1_7_ = uVar33;
                  name_00._reader._32_8_ = aVar20;
                  name_00._reader._40_8_ = uVar34;
                  expressionString(name_00);
                  kj::str<char_const(&)[2],kj::String,char_const(&)[49]>
                            ((String *)local_418,(kj *)0x57c9bf,
                             (char (*) [2])&stack0xfffffffffffffb38,
                             (String *)"\' cannot be applied to this kind of declaration.",
                             (char (*) [49])params_2);
                  params_2 = (long)aStack_410.textValue.super_StringPtr.content.ptr +
                             (ulong)(aStack_410._0_8_ == (CapTableBuilder *)0x0);
                  uVar14 = 0;
                  if (local_448.dataSize < 0x40) {
                    uVar22 = 0;
                  }
                  else {
                    uVar22 = (ulong)*(uint *)((long)local_448.data + 4);
                    if (0x9f < local_448.dataSize) {
                      uVar14 = (ulong)*(uint *)((long)local_448.data + 0x10);
                    }
                  }
                  index = EVar32;
                  (**pEVar3->_vptr_ErrorReporter)(pEVar3,uVar22,uVar14);
                  auVar11 = local_418;
                  EVar32 = index;
                  if (local_418 != (undefined1  [8])0x0) {
                    params_2 = aStack_410.intValue;
                    _local_418 = (undefined1  [16])0x0;
                    (**((CapTableReader *)
                       &(aStack_410.capabilityValue.super_Client.hook.ptr)->_vptr_ClientHook)->
                       _vptr_CapTableReader)
                              (aStack_410.textValue.super_StringPtr.content.size_,auVar11,1);
                  }
                  if (CONCAT71(uVar33,DVar25.value) != 0) {
                    (*(code *)((((SegmentBuilder *)uVar34)->super_SegmentReader).arena)->_vptr_Arena
                    )(uVar34,CONCAT71(uVar33,DVar25.value),1);
                    params_2 = aVar20;
                  }
                }
                this = local_450;
                if ((local_2c8.dataSize < 0x10) || (*local_2c8.data == 0)) {
                  uVar16 = local_358._0_2_;
                  local_368 = (byte *)uVar15;
                  uStack_360 = 0;
                  if (uVar16 < 4) {
                    uVar15 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
                    pWVar12 = (WirePointer *)0x0;
                    aVar20 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
                  }
                  else {
                    pWVar12 = (WirePointer *)(lVar21 + 0x18);
                    uVar15 = uVar24;
                    aVar20 = aVar13;
                  }
                  DVar25.value = aVar20._0_1_;
                  uVar33 = aVar20._1_7_;
                  capnp::_::PointerReader::getStruct
                            ((StructReader *)local_418,(PointerReader *)&stack0xfffffffffffffb38,
                             (word *)0x0);
                  if ((aStack_410._24_4_ < 0x10) ||
                     (*(short *)&((CapTableReader *)&(aStack_410.structValue.reader.segment)->arena)
                                 ->_vptr_CapTableReader == 0)) {
                    capnp::_::PointerBuilder::getStruct
                              ((StructBuilder *)local_418,(PointerBuilder *)&stack0xfffffffffffffb38
                               ,(StructSize)0x10002,(word *)0x0);
                    *(undefined2 *)
                     &((CapTableReader *)&(aStack_410.structValue.reader.segment)->arena)->
                      _vptr_CapTableReader = 0;
                  }
                  else {
                    pEVar3 = this->errorReporter;
                    name_03._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb28;
                    name_03._reader.segment = (SegmentReader *)in_stack_fffffffffffffb20;
                    name_03._reader.data._0_4_ = in_stack_fffffffffffffb30;
                    name_03._reader.data._4_4_ = EVar32;
                    name_03._reader.pointers._0_1_ = DVar25.value;
                    name_03._reader.pointers._1_7_ = uVar33;
                    name_03._reader._32_8_ = uVar15;
                    name_03._reader._40_8_ = pWVar12;
                    expressionString(name_03);
                    kj::str<char_const(&)[2],kj::String,char_const(&)[20]>
                              ((String *)local_418,(kj *)0x57c9bf,
                               (char (*) [2])&stack0xfffffffffffffb38,
                               (String *)"\' requires a value.",(char (*) [20])params_2);
                    params_2 = (long)aStack_410.textValue.super_StringPtr.content.ptr +
                               (ulong)(aStack_410._0_8_ == (CapTableBuilder *)0x0);
                    uVar14 = 0;
                    if (local_448.dataSize < 0x40) {
                      uVar22 = 0;
                    }
                    else {
                      uVar22 = (ulong)*(uint *)((long)local_448.data + 4);
                      if (0x9f < local_448.dataSize) {
                        uVar14 = (ulong)*(uint *)((long)local_448.data + 0x10);
                      }
                    }
                    index = EVar32;
                    (**pEVar3->_vptr_ErrorReporter)(pEVar3,uVar22,uVar14);
                    auVar11 = local_418;
                    if (local_418 != (undefined1  [8])0x0) {
                      params_2 = aStack_410.intValue;
                      _local_418 = (undefined1  [16])0x0;
                      (**((CapTableReader *)
                         &(aStack_410.capabilityValue.super_Client.hook.ptr)->_vptr_ClientHook)->
                         _vptr_CapTableReader)
                                (aStack_410.textValue.super_StringPtr.content.size_,auVar11,1);
                    }
                    if (CONCAT71(uVar33,DVar25.value) != 0) {
                      (**(code **)*pWVar12)(pWVar12,CONCAT71(uVar33,DVar25.value),1);
                      params_2 = uVar15;
                    }
                    if (uVar16 < 4) {
                      aStack_410._16_4_ = 0x7fffffff;
                      uVar24 = (SegmentBuilder *)0x0;
                      aStack_410.textValue.super_StringPtr.content.size_ =
                           (size_t)(SegmentReader *)0x0;
                      aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
                    }
                    else {
                      aStack_410.structValue.reader.segment = (SegmentReader *)(lVar21 + 0x18);
                      aStack_410._16_4_ = (ListElementCount)local_368;
                    }
                    local_418 = (undefined1  [8])aVar13;
                    aStack_410.intValue = uVar24;
                    capnp::_::PointerReader::getStruct
                              (local_b8,(PointerReader *)local_418,(word *)0x0);
                    aStack_410.intValue = (int64_t)local_348.capTable;
                    local_418 = (undefined1  [8])local_348.segment;
                    aStack_410.textValue.super_StringPtr.content.size_ = (size_t)local_348.pointers;
                    this_00 = (NodeTranslator *)local_140;
                    capnp::_::PointerBuilder::getStruct
                              ((StructBuilder *)this_00,(PointerBuilder *)local_418,
                               (StructSize)0x10002,(word *)0x0);
                    type._reader.capTable = local_b8[0].capTable;
                    type._reader.segment = local_b8[0].segment;
                    type._reader.data = local_b8[0].data;
                    type._reader.pointers = local_b8[0].pointers;
                    type._reader.dataSize = (StructDataBitCount)local_b8[0]._32_8_;
                    type._reader._36_4_ = SUB84(local_b8[0]._32_8_,4);
                    type._reader.nestingLimit = (int)local_b8[0]._40_8_;
                    type._reader._44_4_ = SUB84(local_b8[0]._40_8_,4);
                    target_00._builder.capTable = (CapTableBuilder *)local_140._8_8_;
                    target_00._builder.segment = (SegmentBuilder *)local_140._0_8_;
                    target_00._builder.data = (void *)local_140._16_8_;
                    target_00._builder.pointers = (WirePointer *)local_140._24_8_;
                    target_00._builder.dataSize = local_140._32_4_;
                    target_00._builder.pointerCount = local_140._36_2_;
                    target_00._builder._38_2_ = local_140._38_2_;
                    compileDefaultDefaultValue(this_00,type,target_00);
                  }
                }
                else if (*local_2c8.data == 1) {
                  local_368 = (byte *)uVar15;
                  uStack_360 = 0;
                  aStack_410.anyPointerValue.reader.capTable =
                       (CapTableReader *)(local_2c8.pointers + 1);
                  local_418 = (undefined1  [8])local_2c8.segment;
                  aStack_410.intValue = (int64_t)local_2c8.capTable;
                  aStack_410._16_4_ = local_2c8.nestingLimit;
                  if (local_2c8.pointerCount < 2) {
                    aStack_410.textValue.super_StringPtr.content.size_ = (size_t)(WirePointer *)0x0;
                    aStack_410._16_4_ = 0x7fffffff;
                    local_418 = (undefined1  [8])(Exception *)0x0;
                    aStack_410.intValue = (int64_t)(SegmentBuilder *)0x0;
                  }
                  local_358 = ZEXT416((uint)local_358._0_4_);
                  capnp::_::PointerReader::getStruct
                            (&local_e8,(PointerReader *)local_418,(word *)0x0);
                  if ((ushort)local_358._0_2_ < 4) {
                    aStack_410._16_4_ = 0x7fffffff;
                    uVar24 = (SegmentBuilder *)0x0;
                    aStack_410.textValue.super_StringPtr.content.size_ =
                         (size_t)(SegmentReader *)0x0;
                    aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)0x0;
                  }
                  else {
                    aStack_410.structValue.reader.segment = (SegmentReader *)(lVar21 + 0x18);
                    aStack_410._16_4_ = (ListElementCount)local_368;
                  }
                  local_418 = (undefined1  [8])aVar13;
                  aStack_410.intValue = uVar24;
                  capnp::_::PointerReader::getStruct
                            ((StructReader *)(local_140 + 0x28),(PointerReader *)local_418,
                             (word *)0x0);
                  aStack_410.intValue = (int64_t)local_348.capTable;
                  local_418 = (undefined1  [8])local_348.segment;
                  aStack_410.textValue.super_StringPtr.content.size_ = (size_t)local_348.pointers;
                  capnp::_::PointerBuilder::getStruct
                            (&local_168,(PointerBuilder *)local_418,(StructSize)0x10002,(word *)0x0)
                  ;
                  local_298.ptr.isSet = true;
                  local_298.ptr.field_1 =
                       (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)
                       local_318.capTable;
                  source_00._reader.capTable = local_e8.capTable;
                  source_00._reader.segment = local_e8.segment;
                  source_00._reader.data = local_e8.data;
                  source_00._reader.pointers = local_e8.pointers;
                  source_00._reader.dataSize = local_e8.dataSize;
                  source_00._reader._36_4_ = local_e8._36_4_;
                  source_00._reader.nestingLimit = local_e8.nestingLimit;
                  source_00._reader._44_4_ = local_e8._44_4_;
                  type_00._reader.capTable = (CapTableReader *)pBStack_110;
                  type_00._reader.segment = (SegmentReader *)local_140._40_8_;
                  type_00._reader.data = (void *)local_108.content;
                  type_00._reader.pointers = (WirePointer *)pSStack_100;
                  type_00._reader._32_8_ = local_f8;
                  type_00._reader._40_8_ = pwStack_f0;
                  target_01._builder.capTable = local_168.capTable;
                  target_01._builder.segment = local_168.segment;
                  target_01._builder.data = local_168.data;
                  target_01._builder.pointers = local_168.pointers;
                  target_01._builder.dataSize = local_168.dataSize;
                  target_01._builder.pointerCount = local_168.pointerCount;
                  target_01._builder._38_2_ = local_168._38_2_;
                  in_stack_fffffffffffffb20 = local_168.pointers;
                  in_stack_fffffffffffffb28 = local_168._32_8_;
                  compileBootstrapValue(this,source_00,type_00,target_01,&local_298);
                }
              }
            }
            else {
              pEVar3 = this->errorReporter;
              name_02._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb28;
              name_02._reader.segment = (SegmentReader *)in_stack_fffffffffffffb20;
              name_02._reader.data._0_4_ = in_stack_fffffffffffffb30;
              name_02._reader.data._4_4_ = index;
              name_02._reader.pointers._0_1_ = DVar25.value;
              name_02._reader.pointers._1_7_ = uVar33;
              name_02._reader._32_8_ = aVar13;
              name_02._reader._40_8_ = pWVar12;
              expressionString(name_02);
              kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                        ((String *)local_418,(kj *)0x57c9bf,(char (*) [2])&stack0xfffffffffffffb38,
                         (String *)"\' is not an annotation.",(char (*) [24])params_2);
              auVar11 = (undefined1  [8])(Exception *)0x524569;
              if (aStack_410._0_8_ != (CapTableBuilder *)0x0) {
                auVar11 = local_418;
              }
              params_2 = (long)aStack_410.textValue.super_StringPtr.content.ptr +
                         (ulong)(aStack_410._0_8_ == (CapTableBuilder *)0x0);
              uVar14 = 0;
              if (local_448.dataSize < 0x40) {
                uVar22 = 0;
              }
              else {
                uVar22 = (ulong)*(uint *)((long)local_448.data + 4);
                if (0x9f < local_448.dataSize) {
                  uVar14 = (ulong)*(uint *)((long)local_448.data + 0x10);
                }
              }
              (**pEVar3->_vptr_ErrorReporter)(pEVar3,uVar22,uVar14,auVar11);
              auVar11 = local_418;
              if (local_418 != (undefined1  [8])0x0) {
                params_2 = aStack_410.intValue;
                _local_418 = (undefined1  [16])0x0;
                (**((CapTableReader *)
                   &(aStack_410.capabilityValue.super_Client.hook.ptr)->_vptr_ClientHook)->
                   _vptr_CapTableReader)
                          (aStack_410.textValue.super_StringPtr.content.size_,auVar11,1);
              }
              if (CONCAT71(uVar33,DVar25.value) != 0) {
                (**(code **)*pWVar12)(pWVar12,CONCAT71(uVar33,DVar25.value),1);
                params_2 = aVar13;
              }
            }
          }
          else {
            pEVar3 = this->errorReporter;
            name_01._reader.capTable = (CapTableReader *)in_stack_fffffffffffffb28;
            name_01._reader.segment = (SegmentReader *)in_stack_fffffffffffffb20;
            name_01._reader.data._0_4_ = in_stack_fffffffffffffb30;
            name_01._reader.data._4_4_ = index;
            name_01._reader.pointers._0_1_ = DVar25.value;
            name_01._reader.pointers._1_7_ = uVar33;
            name_01._reader._32_8_ = aVar13;
            name_01._reader._40_8_ = pWVar12;
            pSVar26 = local_448.segment;
            pCVar27 = local_448.capTable;
            pvVar28 = local_448.data;
            pWVar29 = local_448.pointers;
            SVar30 = local_448.dataSize;
            expressionString(name_01);
            kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                      ((String *)local_418,(kj *)0x57c9bf,(char (*) [2])&stack0xfffffffffffffb38,
                       (String *)"\' is not an annotation.",(char (*) [24])params_2);
            auVar11 = (undefined1  [8])(Exception *)0x524569;
            if (aStack_410._0_8_ != (CapTableBuilder *)0x0) {
              auVar11 = local_418;
            }
            params_2 = (long)aStack_410.textValue.super_StringPtr.content.ptr +
                       (ulong)(aStack_410._0_8_ == (CapTableBuilder *)0x0);
            uVar14 = 0;
            if (local_448.dataSize < 0x40) {
              uVar22 = 0;
            }
            else {
              uVar22 = (ulong)*(uint *)((long)local_448.data + 4);
              if (0x9f < local_448.dataSize) {
                uVar14 = (ulong)*(uint *)((long)local_448.data + 0x10);
              }
            }
            (**pEVar3->_vptr_ErrorReporter)(pEVar3,uVar22,uVar14,auVar11);
            auVar11 = local_418;
            if (local_418 != (undefined1  [8])0x0) {
              params_2 = aStack_410.intValue;
              _local_418 = (undefined1  [16])0x0;
              (**((CapTableReader *)
                 &(aStack_410.capabilityValue.super_Client.hook.ptr)->_vptr_ClientHook)->
                 _vptr_CapTableReader)
                        (aStack_410.textValue.super_StringPtr.content.size_,auVar11,1,params_2,
                         params_2,0,pSVar26,pCVar27,pvVar28,pWVar29,SVar30,iVar31);
            }
            if (CONCAT71(uVar33,DVar25.value) != 0) {
              (**(code **)*pWVar12)(pWVar12,CONCAT71(uVar33,DVar25.value),1);
              params_2 = aVar13;
            }
          }
          uVar8 = local_218[0];
        }
        pBVar6 = BStack_210.brand.ptr;
        if (((uVar8 & VOID) != UNKNOWN) && (BStack_210.brand.ptr != (BrandScope *)0x0)) {
          BStack_210.brand.ptr = (BrandScope *)0x0;
          (**(BStack_210.brand.disposer)->_vptr_Disposer)
                    (BStack_210.brand.disposer,
                     (pBVar6->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                     (long)&(pBVar6->super_Refcounted).super_Disposer._vptr_Disposer);
        }
        index = index + 1;
      } while (index < annotations.reader.elementCount);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<List<schema::Annotation>> NodeTranslator::compileAnnotationApplications(
    List<Declaration::AnnotationApplication>::Reader annotations,
    kj::StringPtr targetsFlagName) {
  if (annotations.size() == 0 || !compileAnnotations) {
    // Return null.
    return Orphan<List<schema::Annotation>>();
  }

  auto result = orphanage.newOrphan<List<schema::Annotation>>(annotations.size());
  auto builder = result.get();

  for (uint i = 0; i < annotations.size(); i++) {
    Declaration::AnnotationApplication::Reader annotation = annotations[i];
    schema::Annotation::Builder annotationBuilder = builder[i];

    // Set the annotation's value to void in case we fail to produce something better below.
    annotationBuilder.initValue().setVoid();

    auto name = annotation.getName();
    KJ_IF_SOME(decl, compileDeclExpression(name, ImplicitParams::none())) {
      KJ_IF_SOME(kind, decl.getKind()) {
        if (kind != Declaration::ANNOTATION) {
          errorReporter.addErrorOn(name, kj::str(
              "'", expressionString(name), "' is not an annotation."));
        } else {
          annotationBuilder.setId(decl.getIdAndFillBrand(
              [&]() { return annotationBuilder.initBrand(); }));
          KJ_IF_SOME(annotationSchema,
                      resolver.resolveBootstrapSchema(annotationBuilder.getId(),
                                                      annotationBuilder.getBrand())) {
            auto node = annotationSchema.getProto().getAnnotation();
            if (!toDynamic(node).get(targetsFlagName).as<bool>()) {
              errorReporter.addErrorOn(name, kj::str(
                  "'", expressionString(name), "' cannot be applied to this kind of declaration."));
            }

            // Interpret the value.
            auto value = annotation.getValue();
            switch (value.which()) {
              case Declaration::AnnotationApplication::Value::NONE:
                // No value, i.e. void.
                if (node.getType().isVoid()) {
                  annotationBuilder.getValue().setVoid();
                } else {
                  errorReporter.addErrorOn(name, kj::str(
                      "'", expressionString(name), "' requires a value."));
                  compileDefaultDefaultValue(node.getType(), annotationBuilder.getValue());
                }
                break;

              case Declaration::AnnotationApplication::Value::EXPRESSION:
                compileBootstrapValue(value.getExpression(), node.getType(),
                                      annotationBuilder.getValue(),
                                      annotationSchema);
                break;
            }
          }
        }
      } else {
        errorReporter.addErrorOn(name, kj::str(
            "'", expressionString(name), "' is not an annotation."));
      }
    }
  }